

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.h
# Opt level: O0

void quicly_loss_init(quicly_loss_t *r,quicly_loss_conf_t *conf,uint32_t initial_rtt,
                     uint16_t *max_ack_delay,uint8_t *ack_delay_exponent)

{
  uint32_t in_EDX;
  quicly_loss_conf_t *in_RSI;
  void *in_RDI;
  undefined1 local_c0 [24];
  undefined1 local_a8;
  quicly_sentmap_t *map;
  undefined1 auStack_98 [32];
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined1 auStack_60 [16];
  undefined1 auStack_50 [60];
  uint32_t local_14;
  quicly_loss_conf_t *local_10;
  void *local_8;
  
  local_a8 = 0;
  map = (quicly_sentmap_t *)0x0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(auStack_98,0,0x20);
  local_78 = 0;
  local_70 = 0x7fffffffffffffff;
  local_68 = 0x7fffffffffffffff;
  memset(auStack_60,0,0x10);
  memset(auStack_50,0,0x28);
  memcpy(in_RDI,local_c0,0x98);
  quicly_rtt_init((quicly_rtt_t *)((long)local_8 + 0x60),local_10,local_14);
  quicly_sentmap_init(map);
  return;
}

Assistant:

inline void quicly_loss_init(quicly_loss_t *r, const quicly_loss_conf_t *conf, uint32_t initial_rtt, const uint16_t *max_ack_delay,
                             const uint8_t *ack_delay_exponent)
{
    *r = (quicly_loss_t){.conf = conf,
                         .max_ack_delay = max_ack_delay,
                         .ack_delay_exponent = ack_delay_exponent,
                         .pto_count = 0,
                         .time_of_last_packet_sent = 0,
                         .largest_acked_packet_plus1 = {0},
                         .total_bytes_sent = 0,
                         .loss_time = INT64_MAX,
                         .alarm_at = INT64_MAX};
    quicly_rtt_init(&r->rtt, conf, initial_rtt);
    quicly_sentmap_init(&r->sentmap);
}